

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

size_t ma_dr_wav__write_or_count_metadata
                 (ma_dr_wav *pWav,ma_dr_wav_metadata *pMetadatas,ma_uint32 metadataCount)

{
  ma_dr_wav_metadata_type mVar1;
  ma_uint32 mVar2;
  int iVar3;
  ma_uint64 mVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  ma_uint32 *pmVar21;
  uint uVar22;
  ma_uint8 mVar23;
  ulong uVar24;
  char *pcVar25;
  void *pvVar26;
  uint uVar27;
  ma_uint32 mVar28;
  long lVar29;
  bool bVar30;
  size_t local_110;
  ulong local_f0;
  char reservedBuf [180];
  
  bVar30 = false;
  if (metadataCount == 0 || pMetadatas == (ma_dr_wav_metadata *)0x0) {
    local_110 = 0;
  }
  else {
    local_f0 = (ulong)metadataCount;
    local_110 = 0;
    bVar8 = false;
    for (uVar24 = 0; bVar6 = true, uVar24 != local_f0; uVar24 = uVar24 + 1) {
      mVar1 = pMetadatas[uVar24].type;
      bVar5 = bVar6;
      if (((mVar1 & ma_dr_wav_metadata_type_list_all_info_strings) == ma_dr_wav_metadata_type_none)
         && (bVar5 = bVar30, mVar1 == ma_dr_wav_metadata_type_unknown)) {
        mVar28 = pMetadatas[uVar24].data.smpl.productId;
        if (mVar28 == 2) {
          bVar5 = bVar6;
        }
LAB_0017abf1:
        bVar7 = bVar8;
        if (mVar28 == 3) {
          bVar7 = bVar6;
        }
LAB_0017ac24:
        bVar30 = bVar5;
        if (mVar28 == 1) {
          mVar28 = pMetadatas[uVar24].data.smpl.samplePeriodNanoseconds;
          sVar9 = 4;
          if (pWav != (ma_dr_wav *)0x0) {
            sVar9 = (*pWav->onWrite)(pWav->pUserData,&pMetadatas[uVar24].data,4);
          }
          sVar10 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,mVar28);
          uVar11 = (ulong)pMetadatas[uVar24].data.smpl.samplePeriodNanoseconds;
          if (pWav != (ma_dr_wav *)0x0) {
            uVar11 = (*pWav->onWrite)(pWav->pUserData,
                                      pMetadatas[uVar24].data.bext.pOriginatorReference,uVar11);
          }
          local_110 = sVar9 + local_110 + sVar10 + uVar11;
          goto LAB_0017b4a8;
        }
        goto switchD_0017ac1a_caseD_3;
      }
      bVar7 = bVar6;
      if (((mVar1 & ma_dr_wav_metadata_type_list_all_adtl) == ma_dr_wav_metadata_type_none) &&
         (bVar7 = bVar8, mVar1 == ma_dr_wav_metadata_type_unknown)) {
        mVar28 = pMetadatas[uVar24].data.smpl.productId;
        goto LAB_0017abf1;
      }
      bVar30 = bVar5;
      switch(mVar1) {
      case ma_dr_wav_metadata_type_unknown:
        mVar28 = pMetadatas[uVar24].data.smpl.productId;
        goto LAB_0017ac24;
      case ma_dr_wav_metadata_type_smpl:
        mVar28 = pMetadatas[uVar24].data.smpl.sampleLoopCount;
        mVar2 = pMetadatas[uVar24].data.smpl.samplerSpecificDataSizeInBytes;
        sVar9 = 4;
        if (pWav != (ma_dr_wav *)0x0) {
          sVar9 = (*pWav->onWrite)(pWav->pUserData,"smpl",4);
        }
        mVar28 = mVar28 * 0x18 + mVar2 + 0x24;
        sVar10 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,mVar28);
        sVar13 = ma_dr_wav__write_or_count_u32ne_to_le
                           (pWav,pMetadatas[uVar24].data.cue.cuePointCount);
        sVar14 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,pMetadatas[uVar24].data.smpl.productId);
        sVar15 = ma_dr_wav__write_or_count_u32ne_to_le
                           (pWav,pMetadatas[uVar24].data.smpl.samplePeriodNanoseconds);
        sVar16 = ma_dr_wav__write_or_count_u32ne_to_le
                           (pWav,pMetadatas[uVar24].data.smpl.midiUnityNote);
        sVar17 = ma_dr_wav__write_or_count_u32ne_to_le
                           (pWav,pMetadatas[uVar24].data.smpl.midiPitchFraction);
        sVar18 = ma_dr_wav__write_or_count_u32ne_to_le
                           (pWav,pMetadatas[uVar24].data.smpl.smpteFormat);
        sVar19 = ma_dr_wav__write_or_count_u32ne_to_le
                           (pWav,pMetadatas[uVar24].data.smpl.smpteOffset);
        sVar20 = ma_dr_wav__write_or_count_u32ne_to_le
                           (pWav,pMetadatas[uVar24].data.smpl.sampleLoopCount);
        sVar12 = ma_dr_wav__write_or_count_u32ne_to_le
                           (pWav,pMetadatas[uVar24].data.smpl.samplerSpecificDataSizeInBytes);
        local_110 = sVar12 + sVar20 + sVar19 + sVar18 + sVar17 +
                    sVar16 + sVar15 + sVar14 + sVar13 + sVar9 + local_110 + sVar10;
        lVar29 = 0;
        for (uVar11 = 0; uVar11 < pMetadatas[uVar24].data.smpl.sampleLoopCount; uVar11 = uVar11 + 1)
        {
          sVar9 = ma_dr_wav__write_or_count_u32ne_to_le
                            (pWav,*(ma_uint32 *)
                                   ((long)&(pMetadatas[uVar24].data.smpl.pLoops)->cuePointId +
                                   lVar29));
          sVar10 = ma_dr_wav__write_or_count_u32ne_to_le
                             (pWav,*(ma_uint32 *)
                                    ((long)&(pMetadatas[uVar24].data.smpl.pLoops)->type + lVar29));
          sVar13 = ma_dr_wav__write_or_count_u32ne_to_le
                             (pWav,*(ma_uint32 *)
                                    ((long)&(pMetadatas[uVar24].data.smpl.pLoops)->
                                            firstSampleByteOffset + lVar29));
          sVar14 = ma_dr_wav__write_or_count_u32ne_to_le
                             (pWav,*(ma_uint32 *)
                                    ((long)&(pMetadatas[uVar24].data.smpl.pLoops)->
                                            lastSampleByteOffset + lVar29));
          sVar15 = ma_dr_wav__write_or_count_u32ne_to_le
                             (pWav,*(ma_uint32 *)
                                    ((long)&(pMetadatas[uVar24].data.smpl.pLoops)->sampleFraction +
                                    lVar29));
          sVar16 = ma_dr_wav__write_or_count_u32ne_to_le
                             (pWav,*(ma_uint32 *)
                                    ((long)&(pMetadatas[uVar24].data.smpl.pLoops)->playCount +
                                    lVar29));
          local_110 = sVar16 + sVar15 + sVar14 + sVar13 + sVar10 + sVar9 + local_110;
          lVar29 = lVar29 + 0x18;
        }
        uVar11 = (ulong)pMetadatas[uVar24].data.smpl.samplerSpecificDataSizeInBytes;
        if (uVar11 != 0) {
          if (pWav != (ma_dr_wav *)0x0) {
            uVar11 = (*pWav->onWrite)(pWav->pUserData,
                                      pMetadatas[uVar24].data.smpl.pSamplerSpecificData,uVar11);
          }
          local_110 = local_110 + uVar11;
        }
        goto LAB_0017b4a8;
      case ma_dr_wav_metadata_type_smpl|ma_dr_wav_metadata_type_unknown:
      case ma_dr_wav_metadata_type_inst|ma_dr_wav_metadata_type_unknown:
      case ma_dr_wav_metadata_type_inst|ma_dr_wav_metadata_type_smpl:
      case ma_dr_wav_metadata_type_inst|ma_dr_wav_metadata_type_smpl|ma_dr_wav_metadata_type_unknown
      :
        break;
      case ma_dr_wav_metadata_type_inst:
        sVar9 = 4;
        if (pWav != (ma_dr_wav *)0x0) {
          sVar9 = (*pWav->onWrite)(pWav->pUserData,"inst",4);
        }
        sVar10 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,7);
        lVar29 = sVar10 + sVar9 + local_110;
        if (pWav == (ma_dr_wav *)0x0) {
          lVar29 = lVar29 + 6;
          local_110 = 1;
        }
        else {
          sVar9 = (*pWav->onWrite)(pWav->pUserData,&pMetadatas[uVar24].data,1);
          sVar10 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar24].data + 1),1);
          sVar13 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar24].data + 2),1);
          sVar14 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar24].data + 3),1);
          sVar15 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar24].data + 4),1);
          sVar16 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar24].data + 5),1);
          lVar29 = sVar16 + sVar15 + sVar14 + sVar13 + sVar10 + sVar9 + lVar29;
          local_110 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas[uVar24].data + 6),
                                       1);
        }
        local_110 = lVar29 + local_110;
        goto LAB_0017b4ae;
      case ma_dr_wav_metadata_type_cue:
        mVar28 = pMetadatas[uVar24].data.cue.cuePointCount;
        sVar9 = 4;
        if (pWav != (ma_dr_wav *)0x0) {
          sVar9 = (*pWav->onWrite)(pWav->pUserData,"cue ",4);
        }
        mVar28 = mVar28 * 0x18 | 4;
        sVar10 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,mVar28);
        sVar13 = ma_dr_wav__write_or_count_u32ne_to_le
                           (pWav,pMetadatas[uVar24].data.cue.cuePointCount);
        local_110 = sVar13 + sVar9 + local_110 + sVar10;
        lVar29 = 0;
        for (uVar11 = 0; uVar11 < pMetadatas[uVar24].data.cue.cuePointCount; uVar11 = uVar11 + 1) {
          sVar10 = ma_dr_wav__write_or_count_u32ne_to_le
                             (pWav,*(ma_uint32 *)
                                    ((pMetadatas[uVar24].data.cue.pCuePoints)->dataChunkId +
                                    lVar29 + -8));
          sVar13 = ma_dr_wav__write_or_count_u32ne_to_le
                             (pWav,*(ma_uint32 *)
                                    ((pMetadatas[uVar24].data.cue.pCuePoints)->dataChunkId +
                                    lVar29 + -4));
          sVar9 = 4;
          if (pWav != (ma_dr_wav *)0x0) {
            sVar9 = (*pWav->onWrite)(pWav->pUserData,
                                     (pMetadatas[uVar24].data.cue.pCuePoints)->dataChunkId + lVar29,
                                     4);
          }
          sVar14 = ma_dr_wav__write_or_count_u32ne_to_le
                             (pWav,*(ma_uint32 *)
                                    ((pMetadatas[uVar24].data.cue.pCuePoints)->dataChunkId +
                                    lVar29 + 4));
          sVar15 = ma_dr_wav__write_or_count_u32ne_to_le
                             (pWav,*(ma_uint32 *)
                                    ((pMetadatas[uVar24].data.cue.pCuePoints)->dataChunkId +
                                    lVar29 + 8));
          sVar16 = ma_dr_wav__write_or_count_u32ne_to_le
                             (pWav,*(ma_uint32 *)
                                    ((pMetadatas[uVar24].data.cue.pCuePoints)->dataChunkId +
                                    lVar29 + 0xc));
          local_110 = sVar16 + sVar15 + sVar14 + sVar9 + sVar10 + local_110 + sVar13;
          lVar29 = lVar29 + 0x18;
        }
LAB_0017b4a8:
        bVar30 = bVar5;
        if ((mVar28 & 1) != 0) {
LAB_0017b4ae:
          sVar9 = ma_dr_wav__write_or_count_byte(pWav,(ma_uint8)uVar24);
          local_110 = local_110 + sVar9;
          bVar30 = bVar5;
        }
        break;
      default:
        if (mVar1 == ma_dr_wav_metadata_type_acid) {
          sVar9 = 4;
          if (pWav != (ma_dr_wav *)0x0) {
            sVar9 = (*pWav->onWrite)(pWav->pUserData,"acid",4);
          }
          sVar10 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,0x18);
          sVar13 = ma_dr_wav__write_or_count_u32ne_to_le
                             (pWav,pMetadatas[uVar24].data.cue.cuePointCount);
          sVar14 = ma_dr_wav__write_or_count_u16ne_to_le
                             (pWav,pMetadatas[uVar24].data.acid.midiUnityNote);
          sVar15 = ma_dr_wav__write_or_count_u16ne_to_le
                             (pWav,pMetadatas[uVar24].data.acid.reserved1);
          sVar16 = ma_dr_wav__write_or_count_f32ne_to_le
                             (pWav,pMetadatas[uVar24].data.acid.reserved2);
          sVar17 = ma_dr_wav__write_or_count_u32ne_to_le
                             (pWav,pMetadatas[uVar24].data.smpl.midiUnityNote);
          sVar18 = ma_dr_wav__write_or_count_u16ne_to_le
                             (pWav,pMetadatas[uVar24].data.acid.meterDenominator);
          sVar19 = ma_dr_wav__write_or_count_u16ne_to_le
                             (pWav,pMetadatas[uVar24].data.acid.meterNumerator);
          sVar20 = ma_dr_wav__write_or_count_f32ne_to_le(pWav,pMetadatas[uVar24].data.acid.tempo);
          local_110 = sVar20 + sVar19 + sVar18 +
                      sVar17 + sVar16 + sVar15 + sVar14 + sVar13 + sVar10 + sVar9 + local_110;
        }
        else if (mVar1 == ma_dr_wav_metadata_type_bext) {
          mVar28 = pMetadatas[uVar24].data.bext.codingHistorySize + 0x25a;
          sVar9 = 4;
          if (pWav != (ma_dr_wav *)0x0) {
            sVar9 = (*pWav->onWrite)(pWav->pUserData,"bext",4);
          }
          sVar10 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,mVar28);
          lVar29 = sVar10 + sVar9 + local_110;
          ma_dr_wav__write_or_count_string_to_fixed_size_buf
                    (pWav,pMetadatas[uVar24].data.bext.pDescription,0x100);
          ma_dr_wav__write_or_count_string_to_fixed_size_buf
                    (pWav,pMetadatas[uVar24].data.bext.pOriginatorName,0x20);
          ma_dr_wav__write_or_count_string_to_fixed_size_buf
                    (pWav,pMetadatas[uVar24].data.bext.pOriginatorReference,0x20);
          sVar9 = 0x40;
          if (pWav == (ma_dr_wav *)0x0) {
            lVar29 = lVar29 + 0x14a;
            sVar10 = 8;
          }
          else {
            sVar10 = (*pWav->onWrite)(pWav->pUserData,
                                      (void *)((long)&pMetadatas[uVar24].data + 0x18),10);
            lVar29 = lVar29 + sVar10 + 0x140;
            sVar10 = (*pWav->onWrite)(pWav->pUserData,
                                      (void *)((long)&pMetadatas[uVar24].data + 0x22),8);
          }
          mVar4 = pMetadatas[uVar24].data.bext.timeReference;
          sVar13 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,(ma_uint32)mVar4);
          sVar14 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,(ma_uint32)(mVar4 >> 0x20));
          sVar15 = ma_dr_wav__write_or_count_u16ne_to_le(pWav,pMetadatas[uVar24].data.bext.version);
          if (pWav != (ma_dr_wav *)0x0) {
            sVar9 = (*pWav->onWrite)(pWav->pUserData,pMetadatas[uVar24].data.bext.pUMID,0x40);
          }
          sVar16 = ma_dr_wav__write_or_count_u16ne_to_le
                             (pWav,pMetadatas[uVar24].data.bext.loudnessValue);
          sVar17 = ma_dr_wav__write_or_count_u16ne_to_le
                             (pWav,pMetadatas[uVar24].data.bext.loudnessRange);
          sVar18 = ma_dr_wav__write_or_count_u16ne_to_le
                             (pWav,pMetadatas[uVar24].data.bext.maxTruePeakLevel);
          sVar19 = ma_dr_wav__write_or_count_u16ne_to_le
                             (pWav,pMetadatas[uVar24].data.bext.maxMomentaryLoudness);
          sVar20 = ma_dr_wav__write_or_count_u16ne_to_le
                             (pWav,pMetadatas[uVar24].data.bext.maxShortTermLoudness);
          lVar29 = sVar20 + sVar19 + sVar18 + sVar17 + sVar16 + sVar9 +
                            sVar10 + sVar13 + sVar14 + sVar15 + lVar29;
          memset(reservedBuf,0,0xb4);
          if (pWav == (ma_dr_wav *)0x0) {
            local_110 = lVar29 + 0xb4;
            sVar9 = (size_t)pMetadatas[uVar24].data.bext.codingHistorySize;
            if (sVar9 != 0) goto LAB_0017b497;
          }
          else {
            local_110 = (*pWav->onWrite)(pWav->pUserData,reservedBuf,0xb4);
            local_110 = lVar29 + local_110;
            uVar11 = (ulong)pMetadatas[uVar24].data.bext.codingHistorySize;
            if (uVar11 != 0) {
              sVar9 = (*pWav->onWrite)(pWav->pUserData,pMetadatas[uVar24].data.bext.pCodingHistory,
                                       uVar11);
LAB_0017b497:
              local_110 = local_110 + sVar9;
            }
          }
          goto LAB_0017b4a8;
        }
      }
switchD_0017ac1a_caseD_3:
      bVar8 = bVar7;
    }
    if (bVar30) {
      mVar28 = 4;
      for (lVar29 = 0; local_f0 * 0x70 - lVar29 != 0; lVar29 = lVar29 + 0x70) {
        uVar27 = *(uint *)((long)&pMetadatas->type + lVar29);
        if ((uVar27 & 0x3fe00) == 0) {
          if ((uVar27 == 1) && (*(int *)((long)&pMetadatas->data + lVar29 + 4) == 2)) {
            mVar28 = mVar28 + *(int *)((long)&pMetadatas->data + lVar29 + 8) + 8;
          }
        }
        else {
          mVar28 = mVar28 + *(int *)((long)&pMetadatas->data + lVar29) + 9;
        }
        mVar28 = mVar28 + (mVar28 & 1);
      }
      sVar9 = 4;
      if (pWav != (ma_dr_wav *)0x0) {
        sVar9 = (*pWav->onWrite)(pWav->pUserData,"LIST",4);
      }
      sVar13 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,mVar28);
      sVar10 = 4;
      if (pWav != (ma_dr_wav *)0x0) {
        sVar10 = (*pWav->onWrite)(pWav->pUserData,"INFO",4);
      }
      local_110 = sVar13 + sVar9 + local_110 + sVar10;
      for (lVar29 = 0; sVar9 = 4, local_f0 * 0x70 != lVar29; lVar29 = lVar29 + 0x70) {
        uVar27 = *(uint *)((long)&pMetadatas->type + lVar29);
        if ((uVar27 & 0x3fe00) == 0) {
          if (((uVar27 == 1) && (*(int *)((long)&pMetadatas->data + lVar29 + 4) == 2)) &&
             (uVar24 = (ulong)*(uint *)((long)&pMetadatas->data + lVar29 + 8), uVar24 != 0)) {
            uVar11 = uVar24;
            if (pWav != (ma_dr_wav *)0x0) {
              sVar9 = (*pWav->onWrite)(pWav->pUserData,(void *)((long)&pMetadatas->data + lVar29),4)
              ;
              uVar11 = (ulong)*(uint *)((long)&pMetadatas->data + lVar29 + 8);
            }
            sVar13 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,(ma_uint32)uVar11);
            mVar23 = (ma_uint8)uVar11;
            sVar10 = uVar24;
            if (pWav != (ma_dr_wav *)0x0) {
              pvVar26 = *(void **)((long)&pMetadatas->data + lVar29 + 0x10);
              sVar10 = (*pWav->onWrite)(pWav->pUserData,pvVar26,uVar24);
              mVar23 = (ma_uint8)pvVar26;
            }
            local_110 = sVar9 + local_110 + sVar13 + sVar10;
            goto LAB_0017b762;
          }
        }
        else {
          if (uVar27 == 0x20000) {
            pcVar25 = "ITRK";
          }
          else if (uVar27 == 0x400) {
            pcVar25 = "ICOP";
          }
          else if (uVar27 == 0x800) {
            pcVar25 = "INAM";
          }
          else if (uVar27 == 0x1000) {
            pcVar25 = "IART";
          }
          else if (uVar27 == 0x2000) {
            pcVar25 = "ICMT";
          }
          else if (uVar27 == 0x4000) {
            pcVar25 = "ICRD";
          }
          else if (uVar27 == 0x8000) {
            pcVar25 = "IGNR";
          }
          else if (uVar27 == 0x10000) {
            pcVar25 = "IPRD";
          }
          else if (uVar27 == 0x200) {
            pcVar25 = "ISFT";
          }
          else {
            pcVar25 = (char *)0x0;
          }
          iVar3 = *(int *)((long)&pMetadatas->data + lVar29);
          if (iVar3 != 0) {
            if (pWav != (ma_dr_wav *)0x0) {
              sVar9 = (*pWav->onWrite)(pWav->pUserData,pcVar25,4);
            }
            uVar27 = iVar3 + 1;
            uVar24 = (ulong)uVar27;
            mVar23 = (ma_uint8)uVar27;
            sVar10 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,uVar27);
            sVar13 = (size_t)*(uint *)((long)&pMetadatas->data + lVar29);
            if (pWav != (ma_dr_wav *)0x0) {
              pvVar26 = *(void **)((long)&pMetadatas->data + lVar29 + 8);
              sVar13 = (*pWav->onWrite)(pWav->pUserData,pvVar26,sVar13);
              mVar23 = (ma_uint8)pvVar26;
            }
            sVar14 = ma_dr_wav__write_or_count_byte(pWav,mVar23);
            local_110 = sVar14 + sVar13 + sVar9 + local_110 + sVar10;
LAB_0017b762:
            if ((uVar24 & 1) != 0) {
              sVar9 = ma_dr_wav__write_or_count_byte(pWav,mVar23);
              local_110 = local_110 + sVar9;
            }
          }
        }
      }
    }
    if (bVar8) {
      mVar28 = 4;
      for (lVar29 = 0; local_f0 * 0x70 - lVar29 != 0; lVar29 = lVar29 + 0x70) {
        iVar3 = *(int *)((long)&pMetadatas->type + lVar29);
        if (iVar3 == 1) {
          if (*(int *)((long)&pMetadatas->data + lVar29 + 4) == 3) {
            mVar28 = mVar28 + *(int *)((long)&pMetadatas->data + lVar29 + 8) + 8;
          }
        }
        else if (iVar3 == 0x40) {
LAB_0017b7d8:
          iVar3 = *(int *)((long)&pMetadatas->data + lVar29 + 4);
          if (iVar3 == 0) {
            mVar28 = mVar28 + 0xc;
          }
          else {
            mVar28 = mVar28 + iVar3 + 0xd;
          }
        }
        else if (iVar3 == 0x100) {
          iVar3 = *(int *)((long)&pMetadatas->data + lVar29 + 0x14);
          if (iVar3 == 0) {
            mVar28 = mVar28 + 0x1c;
          }
          else {
            mVar28 = mVar28 + iVar3 + 0x1d;
          }
        }
        else if (iVar3 == 0x80) goto LAB_0017b7d8;
        mVar28 = mVar28 + (mVar28 & 1);
      }
      sVar9 = 4;
      if (pWav != (ma_dr_wav *)0x0) {
        sVar9 = (*pWav->onWrite)(pWav->pUserData,"LIST",4);
      }
      sVar13 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,mVar28);
      sVar10 = 4;
      if (pWav != (ma_dr_wav *)0x0) {
        sVar10 = (*pWav->onWrite)(pWav->pUserData,"adtl",4);
      }
      local_110 = sVar13 + sVar9 + local_110 + sVar10;
      pmVar21 = &(pMetadatas->data).smpl.samplePeriodNanoseconds;
      while( true ) {
        sVar9 = 4;
        bVar30 = local_f0 == 0;
        local_f0 = local_f0 - 1;
        if (bVar30) break;
        uVar27 = pmVar21[-4];
        if (uVar27 == 1) {
          if (pmVar21[-1] == 3) {
            uVar27 = *pmVar21;
            uVar24 = (ulong)uVar27;
            if (pWav != (ma_dr_wav *)0x0) {
              sVar9 = (*pWav->onWrite)(pWav->pUserData,(ma_dr_wav_smpl *)(pmVar21 + -2),4);
            }
            mVar23 = (ma_uint8)uVar27;
            sVar13 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,uVar27);
            sVar10 = uVar24;
            if (pWav != (ma_dr_wav *)0x0) {
              pvVar26 = *(void **)(pmVar21 + 2);
              sVar10 = (*pWav->onWrite)(pWav->pUserData,pvVar26,uVar24);
              mVar23 = (ma_uint8)pvVar26;
            }
            local_110 = sVar9 + local_110 + sVar13 + sVar10;
            goto LAB_0017bae8;
          }
        }
        else {
          if (uVar27 != 0x40) {
            if (uVar27 == 0x100) {
              sVar10 = sVar9;
              if (pWav != (ma_dr_wav *)0x0) {
                sVar10 = (*pWav->onWrite)(pWav->pUserData,"ltxt",4);
              }
              uVar24 = (ulong)(pmVar21[3] + 0x15);
              if (pmVar21[3] == 0) {
                uVar24 = 0x14;
              }
              sVar13 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,(ma_uint32)uVar24);
              sVar14 = ma_dr_wav__write_or_count_u32ne_to_le
                                 (pWav,((ma_dr_wav_smpl *)(pmVar21 + -2))->manufacturerId);
              sVar15 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,pmVar21[-1]);
              if (pWav != (ma_dr_wav *)0x0) {
                sVar9 = (*pWav->onWrite)(pWav->pUserData,pmVar21,4);
              }
              sVar16 = ma_dr_wav__write_or_count_u16ne_to_le(pWav,(ma_uint16)pmVar21[1]);
              sVar17 = ma_dr_wav__write_or_count_u16ne_to_le(pWav,*(ma_uint16 *)((long)pmVar21 + 6))
              ;
              sVar18 = ma_dr_wav__write_or_count_u16ne_to_le(pWav,(ma_uint16)pmVar21[2]);
              mVar23 = (ma_uint8)*(ma_uint16 *)((long)pmVar21 + 10);
              sVar19 = ma_dr_wav__write_or_count_u16ne_to_le
                                 (pWav,*(ma_uint16 *)((long)pmVar21 + 10));
              local_110 = sVar19 + sVar18 + sVar17 + sVar16 + sVar9 +
                          sVar10 + local_110 + sVar14 + sVar15 + sVar13;
              sVar9 = (size_t)pmVar21[3];
              if (sVar9 != 0) {
                if (pWav != (ma_dr_wav *)0x0) {
                  pvVar26 = *(void **)(pmVar21 + 4);
                  sVar9 = (*pWav->onWrite)(pWav->pUserData,pvVar26,sVar9);
                  mVar23 = (ma_uint8)pvVar26;
                }
                sVar10 = ma_dr_wav__write_or_count_byte(pWav,mVar23);
                local_110 = local_110 + sVar10 + sVar9;
              }
              goto LAB_0017bae8;
            }
            if (uVar27 != 0x80) goto LAB_0017bb00;
          }
          uVar22 = pmVar21[-1];
          if (uVar22 != 0) {
            if (pWav != (ma_dr_wav *)0x0) {
              pcVar25 = (char *)0x0;
              if (uVar27 == 0x80) {
                pcVar25 = "note";
              }
              if (uVar27 == 0x40) {
                pcVar25 = "labl";
              }
              sVar9 = (*pWav->onWrite)(pWav->pUserData,pcVar25,4);
              uVar22 = pmVar21[-1];
            }
            uVar24 = (ulong)(uVar22 + 5);
            sVar10 = ma_dr_wav__write_or_count_u32ne_to_le(pWav,uVar22 + 5);
            mVar23 = (ma_uint8)((ma_dr_wav_smpl *)(pmVar21 + -2))->manufacturerId;
            sVar13 = ma_dr_wav__write_or_count_u32ne_to_le
                               (pWav,((ma_dr_wav_smpl *)(pmVar21 + -2))->manufacturerId);
            sVar14 = (size_t)pmVar21[-1];
            if (pWav != (ma_dr_wav *)0x0) {
              pvVar26 = *(void **)pmVar21;
              sVar14 = (*pWav->onWrite)(pWav->pUserData,pvVar26,sVar14);
              mVar23 = (ma_uint8)pvVar26;
            }
            sVar15 = ma_dr_wav__write_or_count_byte(pWav,mVar23);
            local_110 = sVar15 + sVar14 + sVar9 + local_110 + sVar13 + sVar10;
LAB_0017bae8:
            if ((uVar24 & 1) != 0) {
              sVar9 = ma_dr_wav__write_or_count_byte(pWav,mVar23);
              local_110 = local_110 + sVar9;
            }
          }
        }
LAB_0017bb00:
        pmVar21 = pmVar21 + 0x1c;
      }
    }
  }
  return local_110;
}

Assistant:

MA_PRIVATE size_t ma_dr_wav__write_or_count_metadata(ma_dr_wav* pWav, ma_dr_wav_metadata* pMetadatas, ma_uint32 metadataCount)
{
    size_t bytesWritten = 0;
    ma_bool32 hasListAdtl = MA_FALSE;
    ma_bool32 hasListInfo = MA_FALSE;
    ma_uint32 iMetadata;
    if (pMetadatas == NULL || metadataCount == 0) {
        return 0;
    }
    for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
        ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
        ma_uint32 chunkSize = 0;
        if ((pMetadata->type & ma_dr_wav_metadata_type_list_all_info_strings) || (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_info_list)) {
            hasListInfo = MA_TRUE;
        }
        if ((pMetadata->type & ma_dr_wav_metadata_type_list_all_adtl) || (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_adtl_list)) {
            hasListAdtl = MA_TRUE;
        }
        switch (pMetadata->type) {
            case ma_dr_wav_metadata_type_smpl:
            {
                ma_uint32 iLoop;
                chunkSize = MA_DR_WAV_SMPL_BYTES + MA_DR_WAV_SMPL_LOOP_BYTES * pMetadata->data.smpl.sampleLoopCount + pMetadata->data.smpl.samplerSpecificDataSizeInBytes;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "smpl", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.manufacturerId);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.productId);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.samplePeriodNanoseconds);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.midiUnityNote);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.midiPitchFraction);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.smpteFormat);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.smpteOffset);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.sampleLoopCount);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.samplerSpecificDataSizeInBytes);
                for (iLoop = 0; iLoop < pMetadata->data.smpl.sampleLoopCount; ++iLoop) {
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].cuePointId);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].type);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].firstSampleByteOffset);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].lastSampleByteOffset);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].sampleFraction);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.smpl.pLoops[iLoop].playCount);
                }
                if (pMetadata->data.smpl.samplerSpecificDataSizeInBytes > 0) {
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.smpl.pSamplerSpecificData, pMetadata->data.smpl.samplerSpecificDataSizeInBytes);
                }
            } break;
            case ma_dr_wav_metadata_type_inst:
            {
                chunkSize = MA_DR_WAV_INST_BYTES;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "inst", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.midiUnityNote, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.fineTuneCents, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.gainDecibels, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.lowNote, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.highNote, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.lowVelocity, 1);
                bytesWritten += ma_dr_wav__write_or_count(pWav, &pMetadata->data.inst.highVelocity, 1);
            } break;
            case ma_dr_wav_metadata_type_cue:
            {
                ma_uint32 iCuePoint;
                chunkSize = MA_DR_WAV_CUE_BYTES + MA_DR_WAV_CUE_POINT_BYTES * pMetadata->data.cue.cuePointCount;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "cue ", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.cuePointCount);
                for (iCuePoint = 0; iCuePoint < pMetadata->data.cue.cuePointCount; ++iCuePoint) {
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].id);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].playOrderPosition);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].dataChunkId, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].chunkStart);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].blockStart);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.cue.pCuePoints[iCuePoint].sampleByteOffset);
                }
            } break;
            case ma_dr_wav_metadata_type_acid:
            {
                chunkSize = MA_DR_WAV_ACID_BYTES;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "acid", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.acid.flags);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.midiUnityNote);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.reserved1);
                bytesWritten += ma_dr_wav__write_or_count_f32ne_to_le(pWav, pMetadata->data.acid.reserved2);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.acid.numBeats);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.meterDenominator);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.acid.meterNumerator);
                bytesWritten += ma_dr_wav__write_or_count_f32ne_to_le(pWav, pMetadata->data.acid.tempo);
            } break;
            case ma_dr_wav_metadata_type_bext:
            {
                char reservedBuf[MA_DR_WAV_BEXT_RESERVED_BYTES];
                ma_uint32 timeReferenceLow;
                ma_uint32 timeReferenceHigh;
                chunkSize = MA_DR_WAV_BEXT_BYTES + pMetadata->data.bext.codingHistorySize;
                bytesWritten += ma_dr_wav__write_or_count(pWav, "bext", 4);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                bytesWritten += ma_dr_wav__write_or_count_string_to_fixed_size_buf(pWav, pMetadata->data.bext.pDescription, MA_DR_WAV_BEXT_DESCRIPTION_BYTES);
                bytesWritten += ma_dr_wav__write_or_count_string_to_fixed_size_buf(pWav, pMetadata->data.bext.pOriginatorName, MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES);
                bytesWritten += ma_dr_wav__write_or_count_string_to_fixed_size_buf(pWav, pMetadata->data.bext.pOriginatorReference, MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES);
                bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pOriginationDate, sizeof(pMetadata->data.bext.pOriginationDate));
                bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pOriginationTime, sizeof(pMetadata->data.bext.pOriginationTime));
                timeReferenceLow  = (ma_uint32)(pMetadata->data.bext.timeReference & 0xFFFFFFFF);
                timeReferenceHigh = (ma_uint32)(pMetadata->data.bext.timeReference >> 32);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, timeReferenceLow);
                bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, timeReferenceHigh);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.version);
                bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pUMID, MA_DR_WAV_BEXT_UMID_BYTES);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.loudnessValue);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.loudnessRange);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.maxTruePeakLevel);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.maxMomentaryLoudness);
                bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.bext.maxShortTermLoudness);
                MA_DR_WAV_ZERO_MEMORY(reservedBuf, sizeof(reservedBuf));
                bytesWritten += ma_dr_wav__write_or_count(pWav, reservedBuf, sizeof(reservedBuf));
                if (pMetadata->data.bext.codingHistorySize > 0) {
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.bext.pCodingHistory, pMetadata->data.bext.codingHistorySize);
                }
            } break;
            case ma_dr_wav_metadata_type_unknown:
            {
                if (pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_top_level) {
                    chunkSize = pMetadata->data.unknown.dataSizeInBytes;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.id, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.pData, pMetadata->data.unknown.dataSizeInBytes);
                }
            } break;
            default: break;
        }
        if ((chunkSize % 2) != 0) {
            bytesWritten += ma_dr_wav__write_or_count_byte(pWav, 0);
        }
    }
    if (hasListInfo) {
        ma_uint32 chunkSize = 4;
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            if ((pMetadata->type & ma_dr_wav_metadata_type_list_all_info_strings)) {
                chunkSize += 8;
                chunkSize += pMetadata->data.infoText.stringLength + 1;
            } else if (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_info_list) {
                chunkSize += 8;
                chunkSize += pMetadata->data.unknown.dataSizeInBytes;
            }
            if ((chunkSize % 2) != 0) {
                chunkSize += 1;
            }
        }
        bytesWritten += ma_dr_wav__write_or_count(pWav, "LIST", 4);
        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
        bytesWritten += ma_dr_wav__write_or_count(pWav, "INFO", 4);
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            ma_uint32 subchunkSize = 0;
            if (pMetadata->type & ma_dr_wav_metadata_type_list_all_info_strings) {
                const char* pID = NULL;
                switch (pMetadata->type) {
                    case ma_dr_wav_metadata_type_list_info_software:    pID = "ISFT"; break;
                    case ma_dr_wav_metadata_type_list_info_copyright:   pID = "ICOP"; break;
                    case ma_dr_wav_metadata_type_list_info_title:       pID = "INAM"; break;
                    case ma_dr_wav_metadata_type_list_info_artist:      pID = "IART"; break;
                    case ma_dr_wav_metadata_type_list_info_comment:     pID = "ICMT"; break;
                    case ma_dr_wav_metadata_type_list_info_date:        pID = "ICRD"; break;
                    case ma_dr_wav_metadata_type_list_info_genre:       pID = "IGNR"; break;
                    case ma_dr_wav_metadata_type_list_info_album:       pID = "IPRD"; break;
                    case ma_dr_wav_metadata_type_list_info_tracknumber: pID = "ITRK"; break;
                    default: break;
                }
                MA_DR_WAV_ASSERT(pID != NULL);
                if (pMetadata->data.infoText.stringLength) {
                    subchunkSize = pMetadata->data.infoText.stringLength + 1;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pID, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.infoText.pString, pMetadata->data.infoText.stringLength);
                    bytesWritten += ma_dr_wav__write_or_count_byte(pWav, '\0');
                }
            } else if (pMetadata->type == ma_dr_wav_metadata_type_unknown && pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_info_list) {
                if (pMetadata->data.unknown.dataSizeInBytes) {
                    subchunkSize = pMetadata->data.unknown.dataSizeInBytes;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.id, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.unknown.dataSizeInBytes);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.pData, subchunkSize);
                }
            }
            if ((subchunkSize % 2) != 0) {
                bytesWritten += ma_dr_wav__write_or_count_byte(pWav, 0);
            }
        }
    }
    if (hasListAdtl) {
        ma_uint32 chunkSize = 4;
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            switch (pMetadata->type)
            {
                case ma_dr_wav_metadata_type_list_label:
                case ma_dr_wav_metadata_type_list_note:
                {
                    chunkSize += 8;
                    chunkSize += MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES;
                    if (pMetadata->data.labelOrNote.stringLength > 0) {
                        chunkSize += pMetadata->data.labelOrNote.stringLength + 1;
                    }
                } break;
                case ma_dr_wav_metadata_type_list_labelled_cue_region:
                {
                    chunkSize += 8;
                    chunkSize += MA_DR_WAV_LIST_LABELLED_TEXT_BYTES;
                    if (pMetadata->data.labelledCueRegion.stringLength > 0) {
                        chunkSize += pMetadata->data.labelledCueRegion.stringLength + 1;
                    }
                } break;
                case ma_dr_wav_metadata_type_unknown:
                {
                    if (pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_adtl_list) {
                        chunkSize += 8;
                        chunkSize += pMetadata->data.unknown.dataSizeInBytes;
                    }
                } break;
                default: break;
            }
            if ((chunkSize % 2) != 0) {
                chunkSize += 1;
            }
        }
        bytesWritten += ma_dr_wav__write_or_count(pWav, "LIST", 4);
        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, chunkSize);
        bytesWritten += ma_dr_wav__write_or_count(pWav, "adtl", 4);
        for (iMetadata = 0; iMetadata < metadataCount; ++iMetadata) {
            ma_dr_wav_metadata* pMetadata = &pMetadatas[iMetadata];
            ma_uint32 subchunkSize = 0;
            switch (pMetadata->type)
            {
                case ma_dr_wav_metadata_type_list_label:
                case ma_dr_wav_metadata_type_list_note:
                {
                    if (pMetadata->data.labelOrNote.stringLength > 0) {
                        const char *pID = NULL;
                        if (pMetadata->type == ma_dr_wav_metadata_type_list_label) {
                            pID = "labl";
                        }
                        else if (pMetadata->type == ma_dr_wav_metadata_type_list_note) {
                            pID = "note";
                        }
                        MA_DR_WAV_ASSERT(pID != NULL);
                        MA_DR_WAV_ASSERT(pMetadata->data.labelOrNote.pString != NULL);
                        subchunkSize = MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES;
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pID, 4);
                        subchunkSize += pMetadata->data.labelOrNote.stringLength + 1;
                        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.labelOrNote.cuePointId);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.labelOrNote.pString, pMetadata->data.labelOrNote.stringLength);
                        bytesWritten += ma_dr_wav__write_or_count_byte(pWav, '\0');
                    }
                } break;
                case ma_dr_wav_metadata_type_list_labelled_cue_region:
                {
                    subchunkSize = MA_DR_WAV_LIST_LABELLED_TEXT_BYTES;
                    bytesWritten += ma_dr_wav__write_or_count(pWav, "ltxt", 4);
                    if (pMetadata->data.labelledCueRegion.stringLength > 0) {
                        subchunkSize += pMetadata->data.labelledCueRegion.stringLength + 1;
                    }
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.labelledCueRegion.cuePointId);
                    bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, pMetadata->data.labelledCueRegion.sampleLength);
                    bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.labelledCueRegion.purposeId, 4);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.country);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.language);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.dialect);
                    bytesWritten += ma_dr_wav__write_or_count_u16ne_to_le(pWav, pMetadata->data.labelledCueRegion.codePage);
                    if (pMetadata->data.labelledCueRegion.stringLength > 0) {
                        MA_DR_WAV_ASSERT(pMetadata->data.labelledCueRegion.pString != NULL);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.labelledCueRegion.pString, pMetadata->data.labelledCueRegion.stringLength);
                        bytesWritten += ma_dr_wav__write_or_count_byte(pWav, '\0');
                    }
                } break;
                case ma_dr_wav_metadata_type_unknown:
                {
                    if (pMetadata->data.unknown.chunkLocation == ma_dr_wav_metadata_location_inside_adtl_list) {
                        subchunkSize = pMetadata->data.unknown.dataSizeInBytes;
                        MA_DR_WAV_ASSERT(pMetadata->data.unknown.pData != NULL);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.id, 4);
                        bytesWritten += ma_dr_wav__write_or_count_u32ne_to_le(pWav, subchunkSize);
                        bytesWritten += ma_dr_wav__write_or_count(pWav, pMetadata->data.unknown.pData, subchunkSize);
                    }
                } break;
                default: break;
            }
            if ((subchunkSize % 2) != 0) {
                bytesWritten += ma_dr_wav__write_or_count_byte(pWav, 0);
            }
        }
    }
    MA_DR_WAV_ASSERT((bytesWritten % 2) == 0);
    return bytesWritten;
}